

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::generateDestProcessMarker
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid,Time returnTime)

{
  mapped_type *pmVar1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  BaseType fid_index;
  ActionMessage block;
  BaseType local_ec;
  ActionMessage local_e8;
  
  local_ec = fid.gid;
  pmVar1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->ongoingDestFilterProcesses,&local_ec);
  if ((pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ActionMessage::ActionMessage(&local_e8,cmd_time_block);
    local_e8.source_id.gid = (this->mFedID).gid;
    local_e8.dest_id.gid = fid.gid;
    local_e8.sequenceID = pid;
    if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  this_00 = &std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingDestFilterProcesses,&local_ec)->_M_t;
  local_e8.messageAction = pid;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(this_00,&local_e8.messageAction);
  addTimeReturn(this,pid,returnTime);
  return;
}

Assistant:

void FilterFederate::generateDestProcessMarker(GlobalFederateId fid, uint32_t pid, Time returnTime)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    if (ongoingDestFilterProcesses[fid_index].empty()) {
        ActionMessage block(CMD_TIME_BLOCK);
        block.dest_id = fid;
        block.source_id = mFedID;
        block.sequenceID = pid;
        mSendMessage(block);
    }
    ongoingDestFilterProcesses[fid_index].insert(pid);
    addTimeReturn(pid, returnTime);
}